

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O2

void witness_depth_error_impl(witness_list_t *witnesses,witness_rank_t rank_inclusive,uint depth)

{
  char *pcVar1;
  
  pcVar1 = "s";
  if (depth == 1) {
    pcVar1 = anon_var_dwarf_3b6586a + 9;
  }
  duckdb_je_malloc_printf
            ("<jemalloc>: Should own %u lock%s of rank >= %u:",(ulong)depth,pcVar1,rank_inclusive);
  witness_print_witnesses(witnesses);
  duckdb_je_malloc_printf(anon_var_dwarf_3b657a3 + 8);
  abort();
}

Assistant:

static void
witness_depth_error_impl(const witness_list_t *witnesses,
    witness_rank_t rank_inclusive, unsigned depth) {
	malloc_printf("<jemalloc>: Should own %u lock%s of rank >= %u:", depth,
	    (depth != 1) ?  "s" : "", rank_inclusive);
	witness_print_witnesses(witnesses);
	malloc_printf("\n");
	abort();
}